

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O0

void API::insert_value(STMT *stmt)

{
  vector<value,_std::allocator<value>_> *this;
  bool bVar1;
  int pos_00;
  reference ppTVar2;
  pointer ppVar3;
  _Base_ptr this_00;
  reference pvVar4;
  reference pvVar5;
  value local_1c0;
  Addr local_190;
  IndexInfo local_188;
  undefined1 local_120 [8];
  IndexInfo I;
  _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  iterator it;
  TableInfo *T;
  Addr local_50;
  Addr p;
  string local_38 [36];
  int local_14;
  STMT *pSStack_10;
  int pos;
  STMT *stmt_local;
  
  pSStack_10 = stmt;
  std::__cxx11::string::string(local_38,(string *)&stmt->tableName);
  pos_00 = catalog::existTable(&CM,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  local_14 = pos_00;
  bVar1 = checkInsert(pSStack_10,pos_00);
  if (bVar1) {
    local_50.BlockNum = 0;
    local_50.FileOff = 0;
    STMT::STMT((STMT *)&T,pSStack_10);
    RecordManager::InsertSuchRecord(&RM,(STMT *)&T,&local_50);
    STMT::~STMT((STMT *)&T);
    ppTVar2 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                        (&CM.TableInfoList,(long)local_14);
    it._M_node = (_Base_ptr)*ppTVar2;
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_iterator(&local_a8);
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin(it._M_node + 5);
    while( true ) {
      I._96_8_ = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(it._M_node + 5));
      bVar1 = std::operator!=(&local_a8,(_Self *)&I.field_0x60);
      if (!bVar1) break;
      IndexInfo::IndexInfo((IndexInfo *)local_120);
      std::__cxx11::string::operator=((string *)&I.field_0x20,(string *)&pSStack_10->tableName);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_a8);
      std::__cxx11::string::operator=((string *)&I,(string *)&ppVar3->second);
      this_00 = it._M_node + 2;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_a8);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)this_00,(long)ppVar3->first);
      local_120._4_4_ = *pvVar4;
      IndexInfo::IndexInfo(&local_188,(IndexInfo *)local_120);
      local_190 = local_50;
      this = pSStack_10->v_list;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_a8);
      pvVar5 = std::vector<value,_std::allocator<value>_>::at(this,(long)ppVar3->first);
      value::value(&local_1c0,pvVar5);
      IndexManager::InsertSuchKey(&IM,&local_188,local_190,&local_1c0);
      value::~value(&local_1c0);
      IndexInfo::~IndexInfo(&local_188);
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_a8,0);
      IndexInfo::~IndexInfo((IndexInfo *)local_120);
    }
    printStatement(pSStack_10);
  }
  return;
}

Assistant:

void API::insert_value(STMT *stmt){
    int pos = CM.existTable(stmt->tableName);
    if(!checkInsert(stmt,pos))return;
    //检查无误
    Addr p = {0,0};
    RM.InsertSuchRecord(*stmt,p);
    TableInfo* T = CM.TableInfoList[pos];
    std::map<int,std::string>::iterator it;
    it = T->indexInfo.begin();
    while(it != T->indexInfo.end())
    {
        IndexInfo I;
        I.tableName = stmt->tableName;
        I.indexName = it->second;
        I.type = T->type[it->first];
        //插入B+树
        IM.InsertSuchKey(I,p,stmt->v_list->at(it->first));
        it ++;
    }
    printStatement(stmt);
}